

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcFormalTypeList::add_typed_param(CTcFormalTypeList *this,CTcToken *tok)

{
  CTcFormalTypeEle *ele;
  CTcToken *in_RSI;
  CTcFormalTypeList *in_RDI;
  CTcPrsMem *in_stack_ffffffffffffffd8;
  
  ele = (CTcFormalTypeEle *)operator_new((size_t)in_RDI,in_stack_ffffffffffffffd8);
  CTcToken::get_text(in_RSI);
  CTcToken::get_text_len(in_RSI);
  CTcFormalTypeEle::CTcFormalTypeEle((CTcFormalTypeEle *)in_RSI,(char *)ele,(size_t)in_RDI);
  add(in_RDI,ele);
  return;
}

Assistant:

void CTcFormalTypeList::add_typed_param(const CTcToken *tok)
{
    add(new (G_prsmem) CTcFormalTypeEle(tok->get_text(), tok->get_text_len()));
}